

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O2

char * get_str(char *str,char **name_p)

{
  char *ptr;
  ulong uVar1;
  
  ptr = (char *)INT_CMmalloc(1);
  for (uVar1 = 0; str[uVar1] != '\"'; uVar1 = uVar1 + 1) {
    ptr = (char *)INT_CMrealloc(ptr,uVar1 + 2);
    ptr[uVar1] = str[uVar1];
  }
  ptr[uVar1 & 0xffffffff] = '\0';
  *name_p = ptr;
  return str + uVar1 + 1;
}

Assistant:

static char *
get_str(char *str, const char **name_p)
{
    int name_len = 0;
    char *name = malloc(1);
    while (*str != '"') {
	name = realloc(name, (name_len + 2));
	name[name_len++] = *(str++);
    }
    name[name_len] = 0;
    str++;
    *name_p = name;
    return str;
}